

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

StructUnionTypeSyntax * __thiscall
slang::parsing::Parser::parseStructUnion(Parser *this,SyntaxKind syntaxKind)

{
  Token semi_00;
  Token packed;
  Token openBrace_00;
  ulong uVar1;
  undefined8 uVar2;
  DataTypeSyntax *type;
  SourceLocation SVar3;
  SourceLocation SVar4;
  undefined4 extraout_var;
  StructUnionTypeSyntax *pSVar5;
  Info *pIVar6;
  size_type sVar7;
  EVP_PKEY_CTX *pEVar8;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_type extraout_RDX_02;
  DiagCode code;
  bool bVar9;
  Token TVar10;
  Token TVar11;
  span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> sVar12;
  SourceRange SVar13;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar14;
  Token keyword;
  Token tagged_00;
  Token tagged;
  Token openBrace;
  Token signing;
  Token semi;
  SmallVector<slang::syntax::StructUnionMemberSyntax_*,_5UL> buffer;
  Info *local_1d0;
  TokenKind local_1c8;
  Token local_1b0;
  Token local_1a0;
  undefined1 local_190 [8];
  Token local_188;
  Info *local_178;
  ulong local_170;
  Info *local_168;
  undefined8 local_160;
  SyntaxFactory *local_158;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_150;
  StructUnionMemberSyntax *local_120;
  Token local_118;
  Token local_108;
  Token local_f8;
  undefined8 local_e8;
  Info *pIStack_e0;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> local_d8;
  Token local_a8;
  Token local_98;
  Token local_80;
  SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*> local_70 [2];
  
  TVar10 = ParserBase::consume(&this->super_ParserBase);
  local_168 = TVar10.info;
  uVar1 = TVar10._0_8_;
  local_188 = ParserBase::consumeIf(&this->super_ParserBase,TaggedKeyword);
  local_1d0 = local_188.info;
  local_190 = local_188._0_8_;
  TVar11 = ParserBase::consumeIf(&this->super_ParserBase,PackedKeyword);
  pIVar6 = TVar11.info;
  local_160 = TVar11._0_8_;
  local_f8 = parseSigning(this);
  local_178 = local_f8.info;
  TVar11 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  local_108 = TVar11;
  Token::Token(&local_1a0);
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  if ((TVar11._0_4_ >> 0x10 & 1) == 0) {
    local_118 = ParserBase::peek(&this->super_ParserBase);
    local_170 = uVar1 & 0xffff;
    bVar9 = local_170 == 0x13b;
    local_158 = &this->factory;
    uVar2 = local_118._0_8_;
    while (((short)uVar2 != 1 && (((uint)uVar2 & 0xffff) != 0xe))) {
      sVar12 = (span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>)
               parseAttributes(this);
      Token::Token(&local_1b0);
      TVar11 = ParserBase::peek(&this->super_ParserBase);
      if ((TVar11._0_4_ & 0xfffe) == 0xfa) {
        local_1b0 = ParserBase::consume(&this->super_ParserBase);
        if (pIVar6 == (Info *)0x0) {
          if ((int)local_170 != 0x13b) goto LAB_0032e761;
          SVar13 = Token::range(&local_1b0);
          code.subsystem = Parser;
          code.code = 0x82;
        }
        else {
          SVar13 = Token::range(&local_1b0);
          code.subsystem = Parser;
          code.code = 0x81;
        }
        ParserBase::addDiag(&this->super_ParserBase,code,SVar13);
      }
LAB_0032e761:
      type = parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)
                                ((uint)(local_1d0 != (Info *)0x0 && bVar9) * 2));
      Token::Token(&local_80);
      local_d8.elements =
           parseDeclarators<&slang::syntax::SyntaxFacts::isNotIdOrComma>
                     (this,Semicolon,&local_80,false,false);
      sVar7 = local_d8.elements.size_;
      local_150.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_150.super_SyntaxListBase._0_16_ = ZEXT816(0x508348);
      local_d8.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
      local_d8.super_SyntaxListBase._0_16_ = ZEXT816(0x50b380);
      semi_00.info = local_80.info;
      semi_00.kind = local_80.kind;
      semi_00._2_1_ = local_80._2_1_;
      semi_00.numFlags.raw = local_80.numFlags.raw;
      semi_00.rawLen = local_80.rawLen;
      local_150.super_SyntaxListBase.childCount = sVar12.size_;
      local_150.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> =
           (span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)sVar12;
      local_d8.super_SyntaxListBase.childCount = sVar7;
      local_120 = slang::syntax::SyntaxFactory::structUnionMember
                            (local_158,&local_150,local_1b0,type,&local_d8,semi_00);
      SmallVectorBase<slang::syntax::StructUnionMemberSyntax*>::
      emplace_back<slang::syntax::StructUnionMemberSyntax*>
                ((SmallVectorBase<slang::syntax::StructUnionMemberSyntax*> *)local_70,&local_120);
      if (sVar7 == 0 && (type->super_ExpressionSyntax).super_SyntaxNode.kind == ImplicitType) {
        local_150.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        SVar3 = Token::location((Token *)&local_150);
        SVar4 = Token::location(&local_118);
        if (SVar3 == SVar4) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
      }
      local_118 = ParserBase::peek(&this->super_ParserBase);
      uVar2 = local_118._0_8_;
    }
    local_1a0 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    if (((undefined1  [16])local_1a0 & (undefined1  [16])0x10000) == (undefined1  [16])0x0 &&
        local_70[0].len == 0) {
      SVar3 = Token::location(&local_1a0);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x350005,SVar3);
    }
  }
  else {
    SVar3 = Token::location(&local_108);
    local_1a0 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar3);
  }
  sVar14 = (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>)parseDimensionList(this);
  pEVar8 = (EVP_PKEY_CTX *)sVar14.size_;
  src = pEVar8;
  if (pIVar6 == (Info *)0x0) {
    if (pEVar8 != (EVP_PKEY_CTX *)0x0) {
      local_150.super_SyntaxListBase._0_16_ =
           slang::syntax::SyntaxNode::getFirstToken
                     (&(*(VariableDimensionSyntax **)
                         &((sVar14.data_)->super_ConstTokenOrSyntax).
                          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       )->super_SyntaxNode);
      SVar3 = Token::location((Token *)&local_150);
      local_d8.super_SyntaxListBase._0_16_ =
           slang::syntax::SyntaxNode::getLastToken
                     (*(SyntaxNode **)((long)sVar14.data_ + (long)pEVar8 * 8 + -8));
      SVar13 = Token::range((Token *)&local_d8);
      SVar13.endLoc = SVar13.endLoc;
      SVar13.startLoc = SVar3;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x780005,SVar13);
      src = extraout_RDX;
    }
    if (local_178 != (Info *)0x0) {
      SVar13 = Token::range(&local_f8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x8d0005,SVar13);
      src = extraout_RDX_00;
    }
  }
  local_1c8 = TVar10.kind;
  TVar10 = local_188;
  if (local_1d0 != (Info *)0x0 && local_1c8 == StructKeyword) {
    SVar13 = Token::range(&local_188);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x870005,SVar13);
    TVar10 = local_188;
    local_190._0_2_ = local_188.kind;
    local_190[2] = local_188._2_1_;
    local_190[3] = local_188.numFlags.raw;
    local_190._4_4_ = local_188.rawLen;
    local_1d0 = local_188.info;
    src = extraout_RDX_01;
  }
  TVar11 = local_108;
  local_e8 = local_160;
  local_a8.kind = local_108.kind;
  local_a8._2_1_ = local_108._2_1_;
  local_a8.numFlags.raw = local_108.numFlags.raw;
  local_a8.rawLen = local_108.rawLen;
  local_a8.info = local_108.info;
  local_108 = TVar11;
  pIStack_e0 = pIVar6;
  local_188 = TVar10;
  local_98 = local_f8;
  local_150.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_._0_4_
       = SmallVectorBase<slang::syntax::StructUnionMemberSyntax_*>::copy
                   (local_70,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_150.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_._4_4_
       = extraout_var;
  local_150.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_150.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
       extraout_RDX_02;
  local_150.super_SyntaxListBase._0_16_ = ZEXT816(0x50bd50);
  local_d8.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_d8.super_SyntaxListBase._0_16_ = ZEXT816(0x508278);
  packed.info = pIStack_e0;
  packed.kind = (undefined2)local_e8;
  packed._2_1_ = local_e8._2_1_;
  packed.numFlags.raw = local_e8._3_1_;
  packed.rawLen = local_e8._4_4_;
  openBrace_00.info = local_a8.info;
  openBrace_00.kind = local_a8.kind;
  openBrace_00._2_1_ = local_a8._2_1_;
  openBrace_00.numFlags.raw = local_a8.numFlags.raw;
  openBrace_00.rawLen = local_a8.rawLen;
  keyword.info = local_168;
  keyword.kind = (short)uVar1;
  keyword._2_1_ = (char)(uVar1 >> 0x10);
  keyword.numFlags.raw = (char)(uVar1 >> 0x18);
  keyword.rawLen = (int)(uVar1 >> 0x20);
  tagged_00.info = local_1d0;
  tagged_00.kind = local_190._0_2_;
  tagged_00._2_1_ = local_190[2];
  tagged_00.numFlags.raw = local_190[3];
  tagged_00.rawLen = local_190._4_4_;
  local_d8.super_SyntaxListBase.childCount = (size_t)pEVar8;
  local_d8.elements = sVar14;
  pSVar5 = slang::syntax::SyntaxFactory::structUnionType
                     (&this->factory,syntaxKind,keyword,tagged_00,packed,local_98,openBrace_00,
                      (SyntaxList<slang::syntax::StructUnionMemberSyntax> *)&local_150,local_1a0,
                      (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&local_d8);
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    free(local_70[0].data_);
  }
  return pSVar5;
}

Assistant:

StructUnionTypeSyntax& Parser::parseStructUnion(SyntaxKind syntaxKind) {
    auto keyword = consume();
    auto tagged = consumeIf(TokenKind::TaggedKeyword);
    auto packed = consumeIf(TokenKind::PackedKeyword);
    auto signing = parseSigning();
    auto openBrace = expect(TokenKind::OpenBrace);

    Token closeBrace;
    SmallVector<StructUnionMemberSyntax*> buffer;

    if (openBrace.isMissing())
        closeBrace = missingToken(TokenKind::CloseBrace, openBrace.location());
    else {
        auto curr = peek();
        while (curr.kind != TokenKind::CloseBrace && curr.kind != TokenKind::EndOfFile) {
            auto attributes = parseAttributes();

            Token randomQualifier;
            switch (peek().kind) {
                case TokenKind::RandKeyword:
                case TokenKind::RandCKeyword:
                    randomQualifier = consume();
                    if (packed)
                        addDiag(diag::RandOnPackedMember, randomQualifier.range());
                    else if (keyword.kind == TokenKind::UnionKeyword)
                        addDiag(diag::RandOnUnionMember, randomQualifier.range());
                    break;
                default:
                    break;
            }

            bitmask<TypeOptions> typeOptions;
            if (tagged.valid() && keyword.kind == TokenKind::UnionKeyword)
                typeOptions = TypeOptions::AllowVoid;

            auto& type = parseDataType(typeOptions);

            Token semi;
            auto declarators = parseDeclarators(semi);

            buffer.push_back(
                &factory.structUnionMember(attributes, randomQualifier, type, declarators, semi));

            // If we failed to consume any tokens for this member, skip whatever token is
            // in the way, otherwise we will loop forever.
            if (type.kind == SyntaxKind::ImplicitType && declarators.empty() &&
                peek().location() == curr.location()) {
                skipToken({});
            }

            curr = peek();
        }
        closeBrace = expect(TokenKind::CloseBrace);

        if (buffer.empty() && !closeBrace.isMissing())
            addDiag(diag::ExpectedMember, closeBrace.location());
    }

    auto dims = parseDimensionList();
    if (!packed) {
        if (!dims.empty()) {
            SourceRange range{dims.front()->getFirstToken().location(),
                              dims.back()->getLastToken().range().end()};
            addDiag(diag::PackedDimsOnUnpacked, range);
        }

        if (signing)
            addDiag(diag::UnpackedSigned, signing.range());
    }

    if (keyword.kind == TokenKind::StructKeyword && tagged.valid())
        addDiag(diag::TaggedStruct, tagged.range());

    return factory.structUnionType(syntaxKind, keyword, tagged, packed, signing, openBrace,
                                   buffer.copy(alloc), closeBrace, dims);
}